

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int i2cProcessCall(uint handle,uint reg,uint wVal)

{
  uint uVar1;
  char *pcVar2;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int status;
  my_smbus_data data;
  my_smbus_data *in_stack_ffffffffffffffb0;
  FILE *pFVar3;
  undefined8 in_stack_ffffffffffffffb8;
  int size;
  FILE *in_stack_ffffffffffffffc0;
  uint local_4;
  
  size = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    in_stack_ffffffffffffffc0 = _stderr;
    pcVar2 = myTimeStamp();
    fprintf(in_stack_ffffffffffffffc0,"%s %s: handle=%d reg=%d wVal=%d\n",pcVar2,"i2cProcessCall",
            (ulong)in_EDI,(ulong)in_ESI,in_EDX);
  }
  pFVar3 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar3,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"i2cProcessCall")
      ;
    }
    local_4 = 0xffffffe1;
  }
  else if (in_EDI < 0x40) {
    if (i2cInfo[in_EDI].state == 2) {
      if ((i2cInfo[in_EDI].funcs & 0x800000) == 0) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar3,"%s %s: SMBUS command not supported by driver\n",pcVar2,"i2cProcessCall");
        }
        local_4 = 0xffffff95;
      }
      else if (in_ESI < 0x100) {
        if (in_EDX < 0x10000) {
          uVar1 = my_smbus_access((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                  (char)((ulong)in_stack_ffffffffffffffc0 >> 0x18),
                                  (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x10),size,
                                  in_stack_ffffffffffffffb0);
          pFVar3 = _stderr;
          if ((int)uVar1 < 0) {
            if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
              pcVar2 = myTimeStamp();
              fprintf(pFVar3,"%s %s: error=%d (%m)\n",pcVar2,"i2cProcessCall",(ulong)uVar1);
            }
            local_4 = 0xffffffad;
          }
          else {
            local_4 = in_EDX & 0xffff;
          }
        }
        else {
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar2 = myTimeStamp();
            fprintf(pFVar3,"%s %s: bad wVal (%d)\n",pcVar2,"i2cProcessCall",(ulong)in_EDX);
          }
          local_4 = 0xffffffaf;
        }
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar3,"%s %s: bad reg (%d)\n",pcVar2,"i2cProcessCall",(ulong)in_ESI);
        }
        local_4 = 0xffffffaf;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar3,"%s %s: bad handle (%d)\n",pcVar2,"i2cProcessCall",(ulong)in_EDI);
      }
      local_4 = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar3,"%s %s: bad handle (%d)\n",pcVar2,"i2cProcessCall",(ulong)in_EDI);
    }
    local_4 = 0xffffffe7;
  }
  return local_4;
}

Assistant:

int i2cProcessCall(unsigned handle, unsigned reg, unsigned wVal)
{
   union my_smbus_data data;
   int status;

   DBG(DBG_USER, "handle=%d reg=%d wVal=%d", handle, reg, wVal);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_PROC_CALL) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   if (wVal > 0xFFFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad wVal (%d)", wVal);

   data.word = wVal;

   status = (my_smbus_access(
      i2cInfo[handle].fd,
      PI_I2C_SMBUS_WRITE,
      reg, PI_I2C_SMBUS_PROC_CALL,
      &data));

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_READ_FAILED;
   }

   return 0xFFFF & data.word;
}